

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O2

byte getBinaryLengthByValue(int value)

{
  byte bVar1;
  uint uVar2;
  
  uVar2 = -value;
  if (0 < value) {
    uVar2 = value;
  }
  bVar1 = '\0';
  for (; uVar2 != 0; uVar2 = uVar2 >> 1) {
    bVar1 = bVar1 + '\x01';
  }
  return bVar1;
}

Assistant:

byte getBinaryLengthByValue(int value) {
    value = value < 0 ? (-value) : value;
    byte result = 0;
    while(value != 0) {
        value = value >> 1;
        result = result + 1;
    }
    return result;    
}